

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

void qpdf_set_logger(qpdf_data qpdf,qpdflogger_handle logger)

{
  element_type *this;
  shared_ptr<QPDFLogger> local_28;
  qpdflogger_handle local_18;
  qpdflogger_handle logger_local;
  qpdf_data qpdf_local;
  
  local_18 = logger;
  logger_local = (qpdflogger_handle)qpdf;
  this = std::__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                   ((__shared_ptr_access<QPDF,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)qpdf);
  std::shared_ptr<QPDFLogger>::shared_ptr(&local_28,&local_18->l);
  QPDF::setLogger(this,&local_28);
  std::shared_ptr<QPDFLogger>::~shared_ptr(&local_28);
  return;
}

Assistant:

void
qpdf_set_logger(qpdf_data qpdf, qpdflogger_handle logger)
{
    qpdf->qpdf->setLogger(logger->l);
}